

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Block * __thiscall
wasm::Builder::blockifyWithName
          (Builder *this,Expression *any,Name name,Expression *append,optional<wasm::Type> type)

{
  optional<wasm::Type> type_;
  
  if (((any == (Expression *)0x0) || (any->_id != BlockId)) || (any[1].type.id != 0)) {
    any = (Expression *)makeBlock(this,name,any);
  }
  else {
    *(size_t *)(any + 1) = name.super_IString.str._M_len;
    any[1].type.id = (uintptr_t)name.super_IString.str._M_str;
  }
  if (append == (Expression *)0x0) {
    if (type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged != true) {
      return (Block *)any;
    }
  }
  else {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(((Block *)any)->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
  }
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)
       (long)type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._0_9_;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       (bool)(char)(type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._0_9_ >> 0x40);
  Block::finalize((Block *)any,type_,Unknown);
  return (Block *)any;
}

Assistant:

Block* blockifyWithName(Expression* any,
                          Name name,
                          Expression* append = nullptr,
                          std::optional<Type> type = std::nullopt) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block || block->name.is()) {
      block = makeBlock(name, any);
    } else {
      block->name = name;
    }
    if (append) {
      block->list.push_back(append);
    }
    if (append || type) {
      block->finalize(type);
    }
    return block;
  }